

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

uint __thiscall Kernel::Clause::computeWeightForClauseSelection(Clause *this,Options *opt)

{
  SplitSet *pSVar1;
  bool bVar2;
  long lVar3;
  uint numeralWeight;
  ulong uVar4;
  Term *pTVar5;
  ulong uVar6;
  uint uVar7;
  uint splitWeight;
  byte bVar8;
  NonVariableNonTypeIterator it;
  NonVariableNonTypeIterator local_68;
  
  uVar7 = this->_weight;
  if (uVar7 == 0) {
    uVar4 = *(ulong *)&this->field_0x38 & 0xfffff;
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        uVar7 = uVar7 + (this->_literals[uVar4 - 1]->super_Term)._weight;
        bVar2 = 1 < (long)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar2);
    }
  }
  numeralWeight = 0;
  splitWeight = 0;
  if (((opt->_nonliteralsInClauseWeight).super_OptionValue<bool>.super_AbstractOptionValue.
       field_0x92 == '\x01') &&
     (pSVar1 = (this->super_Unit)._inference._splits, pSVar1 != (SplitSet *)0x0)) {
    splitWeight = (uint)pSVar1->_size;
  }
  if ((opt->_increasedNumeralWeight).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 ==
      '\x01') {
    numeralWeight = getNumeralWeight(this);
  }
  bVar8 = (undefined1  [48])
          ((undefined1  [48])(this->super_Unit)._inference & (undefined1  [48])0x18) !=
          (undefined1  [48])0x0;
  if (((bool)bVar8) &&
     (bVar8 = 1,
     (opt->_restrictNWCtoGC).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01')
     ) {
    if ((*(uint *)&this->field_0x38 & 0xfffff) == 0) {
      bVar8 = 0;
    }
    else {
      uVar4 = 0;
      bVar8 = 0;
      do {
        NonVariableNonTypeIterator::NonVariableNonTypeIterator
                  (&local_68,&this->_literals[uVar4]->super_Term,false);
        while (lVar3 = DAT_00b7e1b0, local_68._stack._cursor != local_68._stack._stack) {
          pTVar5 = NonVariableNonTypeIterator::next(&local_68);
          bVar8 = bVar8 | (byte)(*(uint *)(*(long *)(*(long *)(lVar3 + 0x60) +
                                                    (ulong)pTVar5->_functor * 8) + 0x40) >> 0xe);
        }
        local_68.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore =
             (_func_int **)&PTR__NonVariableNonTypeIterator_00b69b28;
        if (local_68._stack._stack != (Term **)0x0) {
          uVar6 = local_68._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar6 == 0) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack._stack;
          }
          else if (uVar6 < 0x11) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack._stack;
          }
          else if (uVar6 < 0x19) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack._stack;
          }
          else if (uVar6 < 0x21) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack._stack;
          }
          else if (uVar6 < 0x31) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack._stack;
          }
          else if (uVar6 < 0x41) {
            *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack._stack;
          }
          else {
            ::operator_delete(local_68._stack._stack,0x10);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
    }
  }
  uVar7 = computeWeightForClauseSelection(uVar7,splitWeight,numeralWeight,(bool)(bVar8 & 1),opt);
  return uVar7;
}

Assistant:

unsigned Clause::computeWeightForClauseSelection(const Options& opt) const
{
  unsigned w = 0;
  if (_weight) {
    w = _weight;
  } else {
    w = computeWeight();
  }

  unsigned splWeight = 0;
  if (opt.nonliteralsInClauseWeight()) {
    splWeight = splitWeight(); // no longer includes propWeight
  }

  // hack: computation of getNumeralWeight is potentially expensive, so we only compute it if
  // the option increasedNumeralWeight is set to true.
  unsigned numeralWeight = 0;
  if (opt.increasedNumeralWeight())
  {
    numeralWeight = getNumeralWeight();
  }

  bool derivedFromGoal = Unit::derivedFromGoal();
  if(derivedFromGoal && opt.restrictNWCtoGC()){
    bool found = false;
    for(unsigned i=0;i<_length;i++){
      NonVariableNonTypeIterator it(_literals[i]);
      while(it.hasNext()){
        found |= env.signature->getFunction(it.next()->functor())->inGoal();
      }
    }
    if(!found){ derivedFromGoal=false; }
  }

  return Clause::computeWeightForClauseSelection(w, splWeight, numeralWeight, derivedFromGoal, opt);
}